

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::DetachShader::exec(DetachShader *this,Thread *t)

{
  GLuint GVar1;
  code *pcVar2;
  deUint32 dVar3;
  deBool dVar4;
  MessageBuilder *pMVar5;
  Program *pPVar6;
  MessageBuilder local_670;
  MessageBuilder local_4e0;
  MessageBuilder local_350;
  MessageBuilder local_1b0;
  Thread *local_20;
  EGLThread *thread;
  Thread *t_local;
  DetachShader *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  local_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (local_20 != (Thread *)0x0) {
    if (this->m_type == 0x8b31) {
      tcu::ThreadUtil::Thread::newMessage(&local_1b0,local_20);
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                         (&local_1b0,(char (*) [25])"Begin -- glDetachShader(");
      pPVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&pPVar6->program);
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x584b6d);
      pPVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&pPVar6->runtimeVertexShader);
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x5b492c);
      tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End)
      ;
      tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b0);
      do {
        pcVar2 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x4e0);
        pPVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
        GVar1 = pPVar6->program;
        pPVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
        (*pcVar2)(GVar1,pPVar6->runtimeVertexShader);
        dVar3 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
        glu::checkError(dVar3,"detachShader(m_program->program, m_program->runtimeVertexShader)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                        ,0x654);
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
      tcu::ThreadUtil::Thread::newMessage(&local_350,local_20);
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                         (&local_350,(char (*) [24])"End -- glDetachShader()");
      tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End)
      ;
      tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_350);
      pPVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
      pPVar6->runtimeVertexShader = 0;
    }
    else if (this->m_type == 0x8b30) {
      tcu::ThreadUtil::Thread::newMessage(&local_4e0,local_20);
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                         (&local_4e0,(char (*) [25])"Begin -- glDetachShader(");
      pPVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&pPVar6->program);
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x584b6d);
      pPVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,&pPVar6->runtimeFragmentShader);
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x5b492c);
      tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End)
      ;
      tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_4e0);
      do {
        pcVar2 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x4e0);
        pPVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
        GVar1 = pPVar6->program;
        pPVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
        (*pcVar2)(GVar1,pPVar6->runtimeFragmentShader);
        dVar3 = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
        glu::checkError(dVar3,"detachShader(m_program->program, m_program->runtimeFragmentShader)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                        ,0x65b);
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
      tcu::ThreadUtil::Thread::newMessage(&local_670,local_20);
      pMVar5 = tcu::ThreadUtil::MessageBuilder::operator<<
                         (&local_670,(char (*) [24])"End -- glDetachShader()");
      tcu::ThreadUtil::MessageBuilder::operator<<(pMVar5,(EndToken *)&tcu::ThreadUtil::Message::End)
      ;
      tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_670);
      pPVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
      pPVar6->runtimeFragmentShader = 0;
    }
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void DetachShader::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	if (m_type == GL_VERTEX_SHADER)
	{
		thread.newMessage() << "Begin -- glDetachShader(" << m_program->program << ", " << m_program->runtimeVertexShader << ")" << tcu::ThreadUtil::Message::End;
		GLU_CHECK_GLW_CALL(thread.gl, detachShader(m_program->program, m_program->runtimeVertexShader));
		thread.newMessage() << "End -- glDetachShader()" << tcu::ThreadUtil::Message::End;
		m_program->runtimeVertexShader = 0;
	}
	else if (m_type == GL_FRAGMENT_SHADER)
	{
		thread.newMessage() << "Begin -- glDetachShader(" << m_program->program << ", " << m_program->runtimeFragmentShader << ")" << tcu::ThreadUtil::Message::End;
		GLU_CHECK_GLW_CALL(thread.gl, detachShader(m_program->program, m_program->runtimeFragmentShader));
		thread.newMessage() << "End -- glDetachShader()" << tcu::ThreadUtil::Message::End;
		m_program->runtimeFragmentShader = 0;
	}
	else
		DE_ASSERT(false);
}